

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

tuple<int,_int> __thiscall Maze::adjacentCells(Maze *this,int row,int column)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  _Head_base<1UL,_int,_false> in_ECX;
  undefined4 in_register_00000034;
  long lVar7;
  byte local_b3;
  byte local_b2;
  byte local_b1;
  byte local_8d;
  reference local_88;
  int local_74;
  reference local_70;
  int local_5c;
  reference local_58;
  int local_44;
  reference local_40;
  undefined4 local_30;
  int local_2c;
  tuple<int,_int> local_28;
  tuple<int,_int> NoSuccessor;
  int column_local;
  int row_local;
  Maze *this_local;
  
  lVar7 = CONCAT44(in_register_00000034,row);
  local_2c = -1;
  local_30 = 0xffffffff;
  NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)in_ECX._M_head_impl;
  NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       column;
  std::make_tuple<int,int>((int *)&local_28,&local_2c);
  iVar2 = NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl + 1;
  sVar3 = std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::size((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)(lVar7 + 0x58));
  local_8d = 0;
  if ((ulong)(long)iVar2 < sVar3) {
    pvVar4 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   *)(lVar7 + 0x58),
                  (long)(NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                         super__Head_base<0UL,_int,_false>._M_head_impl + 1));
    pvVar5 = std::vector<char,_std::allocator<char>_>::at
                       (pvVar4,(long)(int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                          super__Tuple_impl<1UL,_int>.
                                          super__Head_base<1UL,_int,_false>._M_head_impl);
    local_8d = 0;
    if (*pvVar5 == '0') {
      pvVar6 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)(lVar7 + 0x88),
                    (long)(NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                           super__Head_base<0UL,_int,_false>._M_head_impl + 1));
      local_40 = std::vector<bool,_std::allocator<bool>_>::at
                           (pvVar6,(long)(int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                              super__Tuple_impl<1UL,_int>.
                                              super__Head_base<1UL,_int,_false>._M_head_impl);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_40);
      local_8d = bVar1 ^ 0xff;
    }
  }
  if ((local_8d & 1) == 0) {
    local_b1 = 0;
    if (0 < NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
            _M_head_impl) {
      pvVar4 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     *)(lVar7 + 0x58),
                    (long)(NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                           super__Head_base<0UL,_int,_false>._M_head_impl + -1));
      pvVar5 = std::vector<char,_std::allocator<char>_>::at
                         (pvVar4,(long)(int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                            super__Tuple_impl<1UL,_int>.
                                            super__Head_base<1UL,_int,_false>._M_head_impl);
      local_b1 = 0;
      if (*pvVar5 == '0') {
        pvVar6 = std::
                 vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       *)(lVar7 + 0x88),
                      (long)(NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                             super__Head_base<0UL,_int,_false>._M_head_impl + -1));
        local_58 = std::vector<bool,_std::allocator<bool>_>::at
                             (pvVar6,(long)(int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                                super__Tuple_impl<1UL,_int>.
                                                super__Head_base<1UL,_int,_false>._M_head_impl);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
        local_b1 = bVar1 ^ 0xff;
      }
    }
    if ((local_b1 & 1) == 0) {
      local_b2 = 0;
      if (0 < (int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                   super__Head_base<1UL,_int,_false>._M_head_impl) {
        pvVar4 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::at((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       *)(lVar7 + 0x58),
                      (long)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                            super__Head_base<0UL,_int,_false>._M_head_impl);
        pvVar5 = std::vector<char,_std::allocator<char>_>::at
                           (pvVar4,(long)((int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                               super__Tuple_impl<1UL,_int>.
                                               super__Head_base<1UL,_int,_false>._M_head_impl + -1))
        ;
        local_b2 = 0;
        if (*pvVar5 == '0') {
          pvVar6 = std::
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         *)(lVar7 + 0x88),
                        (long)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                              super__Head_base<0UL,_int,_false>._M_head_impl);
          local_70 = std::vector<bool,_std::allocator<bool>_>::at
                               (pvVar6,(long)((int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                                   super__Tuple_impl<1UL,_int>.
                                                   super__Head_base<1UL,_int,_false>._M_head_impl +
                                             -1));
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_70);
          local_b2 = bVar1 ^ 0xff;
        }
      }
      if ((local_b2 & 1) == 0) {
        iVar2 = (int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                     super__Head_base<1UL,_int,_false>._M_head_impl + 1;
        pvVar4 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::at((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       *)(lVar7 + 0x58),
                      (long)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                            super__Head_base<0UL,_int,_false>._M_head_impl);
        sVar3 = std::vector<char,_std::allocator<char>_>::size(pvVar4);
        local_b3 = 0;
        if ((ulong)(long)iVar2 < sVar3) {
          pvVar4 = std::
                   vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ::at((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)(lVar7 + 0x58),
                        (long)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                              super__Head_base<0UL,_int,_false>._M_head_impl);
          pvVar5 = std::vector<char,_std::allocator<char>_>::at
                             (pvVar4,(long)((int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                                 super__Tuple_impl<1UL,_int>.
                                                 super__Head_base<1UL,_int,_false>._M_head_impl + 1)
                             );
          local_b3 = 0;
          if (*pvVar5 == '0') {
            pvVar6 = std::
                     vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ::at((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           *)(lVar7 + 0x88),
                          (long)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
            local_88 = std::vector<bool,_std::allocator<bool>_>::at
                                 (pvVar6,(long)((int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.
                                                     super__Tuple_impl<1UL,_int>.
                                                     super__Head_base<1UL,_int,_false>._M_head_impl
                                               + 1));
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_88);
            local_b3 = bVar1 ^ 0xff;
          }
        }
        if ((local_b3 & 1) == 0) {
          std::tuple<int,_int>::tuple((tuple<int,_int> *)this,&local_28);
        }
        else {
          std::make_tuple<int&,int>
                    ((int *)this,
                     &NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>
                      ._M_head_impl);
        }
      }
      else {
        local_74 = (int)NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                        super__Head_base<1UL,_int,_false>._M_head_impl + -1;
        std::make_tuple<int&,int>
                  ((int *)this,
                   &NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
                    _M_head_impl);
      }
    }
    else {
      local_5c = NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
                 _M_head_impl + -1;
      std::make_tuple<int,int&>((int *)this,&local_5c);
    }
  }
  else {
    local_44 = NoSuccessor.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
               _M_head_impl + 1;
    std::make_tuple<int,int&>((int *)this,&local_44);
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> Maze::adjacentCells (int row, int column){
    //if theirs a successor return it's index, otherwise return somthing invalid.

    std::tuple<int, int> NoSuccessor = std::make_tuple(-1,-1);
    if(row+1<MazeMatrix.size() && MazeMatrix.at(row+1).at(column) == '0'&& !used.at(row+1).at(column)) {
        return std::make_tuple(row+1, column);
        //checking vertical down
    }
    else if(row >= 1 && MazeMatrix.at(row-1).at(column) == '0' && !used.at(row-1).at(column)){
        return std::make_tuple(row-1, column);
        //checking vertical up
    }
    //
    else if(column >= 1 && MazeMatrix.at(row).at(column -1) == '0' && !used.at(row).at(column-1)){
        return std::make_tuple(row,column -1);
        //checking left
    }
    else if(column+1 < MazeMatrix.at(row).size() && MazeMatrix.at(row).at(column + 1) == '0' && !used.at(row).at(column + 1)){
        return std::make_tuple(row,column + 1);
        //checking right.
    }
    else{
        return NoSuccessor;
    }
}